

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpApiRequest.cpp
# Opt level: O2

int __thiscall
xmrig::HttpApiRequest::accept(HttpApiRequest *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  StringRefType local_40;
  StringRefType local_30;
  
  (this->super_ApiRequest).m_state = STATE_ACCEPTED;
  if ((this->m_parsed == 0) && ((this->m_req->body)._M_string_length != 0)) {
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
    ::Parse<160u,rapidjson::UTF8<char>>
              ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                *)&this->m_body,(this->m_req->body)._M_dataplus._M_p);
    this->m_parsed = 2 - (uint)((this->m_body).parseResult_.code_ == kParseErrorNone);
    iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[3])(this);
    iVar2 = (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
    if ((char)iVar1 != '\0') {
      iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xe])(this);
      if (iVar1 != 2) {
        iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
        local_30.s = "error";
        local_30.length = 5;
        local_40.s = rapidjson::GetParseError_En((this->m_body).parseResult_.code_);
        sVar3 = strlen(local_40.s);
        local_40.length = (SizeType)sVar3;
        iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xc])(this);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)CONCAT44(extraout_var,iVar1),&local_30,&local_40,
                    *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)
                     (CONCAT44(extraout_var_00,iVar2) + 0x10));
      }
      iVar2 = 0;
    }
    return iVar2;
  }
  iVar1 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[3])
                    (this,CONCAT44(in_register_00000034,__fd));
  return iVar1;
}

Assistant:

bool xmrig::HttpApiRequest::accept()
{
    using namespace rapidjson;

    ApiRequest::accept();

    if (m_parsed == 0 && !m_req.body.empty()) {
        m_body.Parse<kParseCommentsFlag | kParseTrailingCommasFlag>(m_req.body.c_str());
        m_parsed = m_body.HasParseError() ? 2 : 1;

        if (!hasParseError()) {
            return true;
        }

        if (type() != REQ_JSON_RPC) {
            reply().AddMember(StringRef(kError), StringRef(GetParseError_En(m_body.GetParseError())), doc().GetAllocator());
        }

        return false;
    }

    return hasParseError();
}